

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

void __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldExtractUint::
ShaderBitfieldOperationCaseBitfieldExtractUint
          (ShaderBitfieldOperationCaseBitfieldExtractUint *this,Context *context,char *name,
          GLSLVersion glslVersion,Data *data,int offset,int bits,int components,char *testStatement)

{
  int local_34;
  int offset_local;
  Data *data_local;
  GLSLVersion glslVersion_local;
  char *name_local;
  Context *context_local;
  ShaderBitfieldOperationCaseBitfieldExtractUint *this_local;
  
  ShaderBitfieldOperationCase::ShaderBitfieldOperationCase
            (&this->super_ShaderBitfieldOperationCase,context,name,"",glslVersion,data,testStatement
            );
  (this->super_ShaderBitfieldOperationCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ShaderBitfieldOperationCaseBitfieldExtractUint_0324cf60;
  this->m_components = components;
  local_34 = offset;
  if (0x20 < offset + bits) {
    local_34 = 0x20 - bits;
  }
  (this->super_ShaderBitfieldOperationCase).m_data.offset = local_34;
  (this->super_ShaderBitfieldOperationCase).m_data.bits = bits;
  return;
}

Assistant:

ShaderBitfieldOperationCaseBitfieldExtractUint(Context& context, const char* name, glu::GLSLVersion glslVersion,
												   Data const& data, int offset, int bits, int components,
												   char const* testStatement)
		: ShaderBitfieldOperationCase(context, name, "", glslVersion, data, testStatement), m_components(components)
	{
		if (offset + bits > 32)
		{
			offset -= (offset + bits) - 32;
		}
		m_data.offset = offset;
		m_data.bits   = bits;
	}